

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O0

_Bool bson_iter_recurse(bson_iter_t *iter,bson_iter_t *child)

{
  uint32_t local_2c;
  uint8_t *puStack_28;
  uint32_t len;
  uint8_t *data;
  bson_iter_t *child_local;
  bson_iter_t *iter_local;
  
  puStack_28 = (uint8_t *)0x0;
  local_2c = 0;
  data = (uint8_t *)child;
  child_local = iter;
  if (iter == (bson_iter_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,0x99,"bson_iter_recurse","iter");
    abort();
  }
  if (child != (bson_iter_t *)0x0) {
    if (iter->raw[iter->type] == '\x03') {
      bson_iter_document(iter,&local_2c,&stack0xffffffffffffffd8);
    }
    else {
      if (iter->raw[iter->type] != '\x04') {
        return false;
      }
      bson_iter_array(iter,&local_2c,&stack0xffffffffffffffd8);
    }
    *(uint8_t **)data = puStack_28;
    *(uint32_t *)(data + 8) = local_2c;
    data[0xc] = '\0';
    data[0xd] = '\0';
    data[0xe] = '\0';
    data[0xf] = '\0';
    data[0x10] = '\0';
    data[0x11] = '\0';
    data[0x12] = '\0';
    data[0x13] = '\0';
    data[0x14] = '\0';
    data[0x15] = '\0';
    data[0x16] = '\0';
    data[0x17] = '\0';
    data[0x18] = '\0';
    data[0x19] = '\0';
    data[0x1a] = '\0';
    data[0x1b] = '\0';
    data[0x1c] = '\0';
    data[0x1d] = '\0';
    data[0x1e] = '\0';
    data[0x1f] = '\0';
    data[0x20] = '\0';
    data[0x21] = '\0';
    data[0x22] = '\0';
    data[0x23] = '\0';
    data[0x24] = '\0';
    data[0x25] = '\0';
    data[0x26] = '\0';
    data[0x27] = '\0';
    data[0x28] = '\x04';
    data[0x29] = '\0';
    data[0x2a] = '\0';
    data[0x2b] = '\0';
    data[0x2c] = '\0';
    data[0x2d] = '\0';
    data[0x2e] = '\0';
    data[0x2f] = '\0';
    return true;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
          ,0x9a,"bson_iter_recurse","child");
  abort();
}

Assistant:

bool
bson_iter_recurse (const bson_iter_t *iter, /* IN */
                   bson_iter_t *child)      /* OUT */
{
   const uint8_t *data = NULL;
   uint32_t len = 0;

   BSON_ASSERT (iter);
   BSON_ASSERT (child);

   if (ITER_TYPE (iter) == BSON_TYPE_DOCUMENT) {
      bson_iter_document (iter, &len, &data);
   } else if (ITER_TYPE (iter) == BSON_TYPE_ARRAY) {
      bson_iter_array (iter, &len, &data);
   } else {
      return false;
   }

   child->raw = data;
   child->len = len;
   child->off = 0;
   child->type = 0;
   child->key = 0;
   child->d1 = 0;
   child->d2 = 0;
   child->d3 = 0;
   child->d4 = 0;
   child->next_off = 4;
   child->err_off = 0;

   return true;
}